

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

Index __thiscall wabt::anon_unknown_1::WatWriter::GetLabelArity(WatWriter *this,Var *var)

{
  Label *pLVar1;
  size_type sVar2;
  Index local_30;
  Label *label;
  Var *var_local;
  WatWriter *this_local;
  
  pLVar1 = GetLabel(this,var);
  if (pLVar1 == (Label *)0x0) {
    this_local._4_4_ = 0;
  }
  else {
    if (pLVar1->label_type == Loop) {
      sVar2 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(&pLVar1->param_types);
      local_30 = (Index)sVar2;
    }
    else {
      sVar2 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(&pLVar1->result_types);
      local_30 = (Index)sVar2;
    }
    this_local._4_4_ = local_30;
  }
  return this_local._4_4_;
}

Assistant:

Index WatWriter::GetLabelArity(const Var& var) {
  Label* label = GetLabel(var);
  if (!label) {
    return 0;
  }

  return label->label_type == LabelType::Loop ? label->param_types.size()
                                              : label->result_types.size();
}